

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmbench.c
# Opt level: O2

int main(int argc,char **argv)

{
  int __fd;
  int iVar1;
  size_t __len;
  char *pcVar2;
  clock_t cVar3;
  clock_t cVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  xm_context_t *ctx;
  float afStack_20038 [32770];
  
  if (argc != 2) {
    fprintf(_stderr,"Usage: %s <filename>\n",*argv);
    goto LAB_0010248c;
  }
  __fd = open(argv[1],0);
  if (__fd == -1) {
    pcVar2 = "Could not open input file";
  }
  else {
    __len = lseek(__fd,0,2);
    if (__len != 0xffffffffffffffff) {
      pcVar2 = (char *)mmap((void *)0x0,__len,1,1,__fd,0);
      if (pcVar2 == (char *)0xffffffffffffffff) {
        perror("mmap() failed");
LAB_0010248c:
        fflush(_stderr);
      }
      else {
        iVar1 = xm_create_context_safe(&ctx,pcVar2,__len,48000);
        if (iVar1 != 0) {
          if (iVar1 != 1) {
            if (iVar1 == 2) {
              pcVar2 = "could not create context: malloc failed\n";
            }
            else {
              pcVar2 = "could not create context: unknown error\n";
            }
            fwrite(pcVar2,0x28,1,_stderr);
            goto LAB_0010248c;
          }
          fwrite("could not create context: module is not sane\n",0x2d,1,_stderr);
          fflush(_stderr);
          ctx = (xm_context_t *)0x0;
        }
        munmap(pcVar2,__len);
        close(__fd);
        if (ctx != (xm_context_t *)0x0) {
          uVar5 = 0;
          cVar3 = clock();
          while (cVar4 = clock(), cVar4 - cVar3 < 5000000) {
            uVar5 = uVar5 + 1;
            xm_generate_samples(ctx,afStack_20038,0x4000);
          }
          cVar4 = clock();
          auVar6._0_8_ = (double)uVar5 * 32768.0;
          auVar6._8_8_ = (double)(cVar4 - cVar3);
          auVar6 = divpd(auVar6,_DAT_00106010);
          printf("Generated %.2f second(s) of %iHz audio in %.2f CPU seconds, playback speed is %.2fx\n"
                 ,auVar6._0_8_,auVar6._8_8_,auVar6._0_8_ / auVar6._8_8_,48000);
          xm_free_context(ctx);
          return 0;
        }
      }
      goto LAB_001023e9;
    }
    close(__fd);
    pcVar2 = "lseek() failed";
  }
  perror(pcVar2);
  fflush(_stderr);
  ctx = (xm_context_t *)0x0;
LAB_001023e9:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	xm_context_t* ctx;
	float buffer[buffer_size];
	clock_t start, end;
	double cpu_time, gen_time;
	unsigned int num_passes = 0;

	if(argc != 2)
		FATAL("Usage: %s <filename>\n", argv[0]);

	create_context_from_file(&ctx, rate, argv[1]);
	if(ctx == NULL) exit(1);

	start = clock();
	while((clock() - start) < ideal_running_time * CLOCKS_PER_SEC) {
		++num_passes;
		xm_generate_samples(ctx, buffer, sizeof(buffer) / (channels * sizeof(float)));
	}
	end = clock();

	cpu_time = (double)(end - start) / CLOCKS_PER_SEC;
	gen_time = (double)num_passes * (double)buffer_size / (channels * rate);
	printf("Generated %.2f second(s) of %iHz audio in %.2f CPU seconds, playback speed is %.2fx\n",
		   gen_time, rate, cpu_time, gen_time / cpu_time);

	xm_free_context(ctx);
	return 0;
}